

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeRegularExpressionCommand.cxx
# Opt level: O1

bool cmIncludeRegularExpressionCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *regex;
  string *psVar1;
  cmMakefile *this;
  bool bVar2;
  long *local_40 [2];
  long local_30 [2];
  
  regex = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar2 = (ulong)((long)psVar1 - (long)regex) < 0x41;
  if (bVar2 && psVar1 != regex) {
    this = status->Makefile;
    cmMakefile::SetIncludeRegularExpression(this,regex);
    if (0x20 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      std::__cxx11::string::_M_assign((string *)&this->ComplainFileRegularExpression);
    }
  }
  else {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
  }
  return bVar2 && psVar1 != regex;
}

Assistant:

bool cmIncludeRegularExpressionCommand(std::vector<std::string> const& args,
                                       cmExecutionStatus& status)
{
  if (args.empty() || args.size() > 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  mf.SetIncludeRegularExpression(args[0]);

  if (args.size() > 1) {
    mf.SetComplainRegularExpression(args[1]);
  }

  return true;
}